

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::Prime(Recycler *this)

{
  bool bVar1;
  ConfigFlagsTable *this_00;
  Recycler *this_local;
  
  this_00 = GetRecyclerFlagsTable(this);
  bVar1 = Js::ConfigFlagsTable::IsEnabled(this_00,ForceFragmentAddressSpaceFlag);
  if (!bVar1) {
    HeapInfoManager::Prime(&this->autoHeap);
  }
  return;
}

Assistant:

void
Recycler::Prime()
{
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (GetRecyclerFlagsTable().IsEnabled(Js::ForceFragmentAddressSpaceFlag))
    {
        // Never prime the recycler if we are forced to fragment address space
        return;
    }
#endif
   autoHeap.Prime();
}